

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

int createAnonymousFile(off_t size)

{
  int iVar1;
  char *__s;
  char *__dest;
  int *piVar2;
  __off_t in_RDI;
  int ret;
  int fd;
  char *name;
  char *path;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_24;
  size_t in_stack_ffffffffffffffe0;
  int local_4;
  
  local_24 = memfd_create("glfw-shared",3);
  if (local_24 < 0) {
    __s = getenv("XDG_RUNTIME_DIR");
    if (__s == (char *)0x0) {
      piVar2 = __errno_location();
      *piVar2 = 2;
      return -1;
    }
    strlen(__s);
    __dest = (char *)_glfw_calloc((size_t)__s,in_stack_ffffffffffffffe0);
    strcpy(__dest,__s);
    strcat(__dest,"/glfw-shared-XXXXXX");
    local_24 = createTmpfileCloexec
                         ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    _glfw_free((void *)0x9e7438);
    if (local_24 < 0) {
      return -1;
    }
  }
  else {
    fcntl(local_24,0x409,3);
  }
  iVar1 = posix_fallocate(local_24,0,in_RDI);
  if (iVar1 == 0) {
    local_4 = local_24;
  }
  else {
    close(local_24);
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int createAnonymousFile(off_t size)
{
    static const char template[] = "/glfw-shared-XXXXXX";
    const char* path;
    char* name;
    int fd;
    int ret;

#ifdef HAVE_MEMFD_CREATE
    fd = memfd_create("glfw-shared", MFD_CLOEXEC | MFD_ALLOW_SEALING);
    if (fd >= 0)
    {
        // We can add this seal before calling posix_fallocate(), as the file
        // is currently zero-sized anyway.
        //
        // There is also no need to check for the return value, we couldn’t do
        // anything with it anyway.
        fcntl(fd, F_ADD_SEALS, F_SEAL_SHRINK | F_SEAL_SEAL);
    }
    else
#elif defined(SHM_ANON)
    fd = shm_open(SHM_ANON, O_RDWR | O_CLOEXEC, 0600);
    if (fd < 0)
#endif
    {
        path = getenv("XDG_RUNTIME_DIR");
        if (!path)
        {
            errno = ENOENT;
            return -1;
        }

        name = _glfw_calloc(strlen(path) + sizeof(template), 1);
        strcpy(name, path);
        strcat(name, template);

        fd = createTmpfileCloexec(name);
        _glfw_free(name);
        if (fd < 0)
            return -1;
    }

#if defined(SHM_ANON)
    // posix_fallocate does not work on SHM descriptors
    ret = ftruncate(fd, size);
#else
    ret = posix_fallocate(fd, 0, size);
#endif
    if (ret != 0)
    {
        close(fd);
        errno = ret;
        return -1;
    }
    return fd;
}